

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::DeconvolutionDepthWise_x86_fma::create_pipeline
          (DeconvolutionDepthWise_x86_fma *this,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int _h;
  int *piVar3;
  ulong uVar4;
  int iVar5;
  Allocator *pAVar6;
  void *pvVar7;
  int iVar8;
  int k;
  ulong uVar9;
  char cVar10;
  int iVar11;
  int _w;
  ulong uVar12;
  Mat local_c8;
  Mat local_78;
  
  if ((this->super_DeconvolutionDepthWise).dynamic_weight != 0) {
    return 0;
  }
  uVar12 = (long)(this->super_DeconvolutionDepthWise).kernel_h *
           (long)(this->super_DeconvolutionDepthWise).kernel_w;
  uVar1 = (this->super_DeconvolutionDepthWise).num_output;
  uVar2 = (this->super_DeconvolutionDepthWise).group;
  uVar4 = (long)(this->super_DeconvolutionDepthWise).weight_data_size / (long)(int)uVar2;
  _w = (int)uVar12;
  uVar4 = (long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) / (long)_w;
  if ((uVar2 != uVar1) ||
     ((int)((long)((ulong)(uint)((int)uVar4 >> 0x1f) << 0x20 | uVar4 & 0xffffffff) /
           (long)((int)uVar1 / (int)uVar2)) * uVar2 != uVar2)) {
    create_group_ops(this,opt);
    if (opt->lightmode != true) {
      return 0;
    }
    piVar3 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar6 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
        if (pAVar6 == (Allocator *)0x0) {
          free((this->super_DeconvolutionDepthWise).weight_data.data);
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_DeconvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
    (this->super_DeconvolutionDepthWise).weight_data.w = 0;
    (this->super_DeconvolutionDepthWise).weight_data.h = 0;
    (this->super_DeconvolutionDepthWise).weight_data.d = 0;
    (this->super_DeconvolutionDepthWise).weight_data.c = 0;
    return 0;
  }
  if (opt->use_packing_layout == true) {
    cVar10 = ((uVar2 & 3) == 0) * '\x03' + '\x01';
    if ((uVar2 & 7) == 0) {
      cVar10 = '\b';
    }
  }
  else {
    cVar10 = '\x01';
  }
  local_c8.cstep = 0;
  local_c8.data = (Allocator *)0x0;
  local_c8.refcount._0_4_ = 0;
  local_c8.refcount._4_4_ = 0;
  local_c8.elemsize = SUB168(ZEXT816(0) << 0x40,4);
  local_c8.elempack = 0;
  iVar11 = 0;
  local_c8.allocator = (Allocator *)local_c8.data;
  local_c8.dims = (int)local_c8.refcount;
  local_c8.w = local_c8.refcount._4_4_;
  local_c8._48_8_ = local_c8.elemsize;
  local_c8.c = local_c8.elempack;
  Mat::create(&local_c8,(this->super_DeconvolutionDepthWise).weight_data.w,4,(Allocator *)0x0);
  pvVar7 = (this->super_DeconvolutionDepthWise).weight_data.data;
  _h = (this->super_DeconvolutionDepthWise).group;
  iVar5 = (uVar2 - (int)uVar2 % _h) * ((this->super_DeconvolutionDepthWise).num_output / _h);
  uVar4 = 0;
  if (0 < _w) {
    uVar4 = uVar12 & 0xffffffff;
  }
  if (iVar5 < 1) {
    iVar5 = 0;
  }
  pAVar6 = (Allocator *)local_c8.data;
  for (; iVar11 != iVar5; iVar11 = iVar11 + 1) {
    iVar8 = _w;
    for (uVar9 = 0; iVar8 = iVar8 + -1, uVar4 != uVar9; uVar9 = uVar9 + 1) {
      *(undefined4 *)((long)&pAVar6->_vptr_Allocator + (long)iVar8 * 4) =
           *(undefined4 *)((long)pvVar7 + uVar9 * 4);
    }
    pAVar6 = (Allocator *)((long)&pAVar6->_vptr_Allocator + uVar12 * 4);
    pvVar7 = (void *)((long)pvVar7 + uVar12 * 4);
  }
  if (cVar10 == '\x01') {
    if (&this->weight_data_tm != &local_c8) {
      piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + 1;
        UNLOCK();
      }
      piVar3 = (this->weight_data_tm).refcount;
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          pAVar6 = (this->weight_data_tm).allocator;
          if (pAVar6 == (Allocator *)0x0) {
            free((this->weight_data_tm).data);
          }
          else {
            (*pAVar6->_vptr_Allocator[3])();
          }
        }
      }
      (this->weight_data_tm).data = local_c8.data;
      (this->weight_data_tm).refcount =
           (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
      (this->weight_data_tm).elemsize = local_c8.elemsize;
      (this->weight_data_tm).elempack = local_c8.elempack;
      (this->weight_data_tm).allocator = local_c8.allocator;
      (this->weight_data_tm).dims = local_c8.dims;
      (this->weight_data_tm).w = local_c8.w;
      (this->weight_data_tm).h = local_c8.h;
      (this->weight_data_tm).d = local_c8.d;
      (this->weight_data_tm).c = local_c8.c;
      (this->weight_data_tm).cstep = local_c8.cstep;
    }
    goto LAB_003e7240;
  }
  if (cVar10 == '\x04') {
    Mat::reshape(&local_78,&local_c8,_w,_h,(Allocator *)0x0);
    convert_packing(&local_78,&this->weight_data_tm,4,opt);
    if (local_78.refcount == (int *)0x0) goto LAB_003e7240;
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount != 0) goto LAB_003e7240;
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      goto LAB_003e7240;
    }
  }
  else {
    if (cVar10 != '\b') goto LAB_003e7240;
    Mat::reshape(&local_78,&local_c8,_w,_h,(Allocator *)0x0);
    convert_packing(&local_78,&this->weight_data_tm,8,opt);
    if (local_78.refcount == (int *)0x0) goto LAB_003e7240;
    LOCK();
    *local_78.refcount = *local_78.refcount + -1;
    UNLOCK();
    if (*local_78.refcount != 0) goto LAB_003e7240;
    if (local_78.allocator != (Allocator *)0x0) {
      (*(local_78.allocator)->_vptr_Allocator[3])();
      goto LAB_003e7240;
    }
  }
  free(local_78.data);
LAB_003e7240:
  if (opt->lightmode == true) {
    piVar3 = (this->super_DeconvolutionDepthWise).weight_data.refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar6 = (this->super_DeconvolutionDepthWise).weight_data.allocator;
        if (pAVar6 == (Allocator *)0x0) {
          free((this->super_DeconvolutionDepthWise).weight_data.data);
        }
        else {
          (*pAVar6->_vptr_Allocator[3])();
        }
      }
    }
    (this->super_DeconvolutionDepthWise).weight_data.cstep = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.refcount + 4) = 0;
    *(undefined8 *)((long)&(this->super_DeconvolutionDepthWise).weight_data.elemsize + 4) = 0;
    (this->super_DeconvolutionDepthWise).weight_data.data = (void *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.refcount = (int *)0x0;
    (this->super_DeconvolutionDepthWise).weight_data.dims = 0;
    (this->super_DeconvolutionDepthWise).weight_data.w = 0;
    (this->super_DeconvolutionDepthWise).weight_data.h = 0;
    (this->super_DeconvolutionDepthWise).weight_data.d = 0;
    (this->super_DeconvolutionDepthWise).weight_data.c = 0;
  }
  piVar3 = (int *)CONCAT44(local_c8.refcount._4_4_,(int)local_c8.refcount);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_c8.allocator == (Allocator *)0x0) {
        free(local_c8.data);
      }
      else {
        (*(local_c8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise_x86_fma::create_pipeline(const Option& opt)
{
    if (dynamic_weight)
        return 0;

    const int maxk = kernel_w * kernel_h;
    int channels = (weight_data_size / group) / maxk / (num_output / group) * group;

    // depth-wise
    if (channels == group && group == num_output)
    {
        int elempack = 1;
#if __SSE2__
        if (opt.use_packing_layout)
        {
#if __AVX512F__
            elempack = channels % 16 == 0 ? 16 : channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#elif __AVX__
            elempack = channels % 8 == 0 ? 8 : channels % 4 == 0 ? 4 : 1;
#else
            elempack = channels % 4 == 0 ? 4 : 1;
#endif
        }
#endif // __SSE2__

        Mat weight_data_transposed(weight_data.w);
        {
            float* pt = weight_data_transposed;
            const float* p = weight_data;

            for (int i = 0; i < (channels / group) * (num_output / group) * group; i++)
            {
                for (int k = 0; k < maxk; k++)
                {
                    pt[maxk - 1 - k] = p[k];
                }

                p += maxk;
                pt += maxk;
            }
        }

#if __SSE2__
#if __AVX__
        // pack16
#if __AVX512F__
        if (elempack == 16)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 16, opt);
        }
#endif // __AVX512F__

        // pack8
        if (elempack == 8)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 8, opt);
        }
#endif // __AVX__

        // pack4
        if (elempack == 4)
        {
            Mat weight_data_r2 = weight_data_transposed.reshape(maxk, group);
            convert_packing(weight_data_r2, weight_data_tm, 4, opt);
        }
#endif // __SSE2__

        if (elempack == 1)
        {
            weight_data_tm = weight_data_transposed;
        }

        if (opt.lightmode)
            weight_data.release();

        return 0;
    }

    // group convolution
    create_group_ops(opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}